

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::layout_for_member_abi_cxx11_
          (CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t id;
  mapped_type *pmVar2;
  ulong uVar3;
  size_t sVar4;
  CompilerError *pCVar5;
  uint in_ECX;
  undefined4 in_register_00000014;
  bool local_349;
  spirv_cross local_328 [38];
  allocator local_302;
  undefined1 local_301;
  undefined4 local_300;
  allocator local_2f9;
  spirv_cross local_2f8 [32];
  spirv_cross local_2d8 [38];
  undefined1 local_2b2;
  allocator local_2b1;
  string local_2b0 [32];
  spirv_cross local_290 [38];
  undefined1 local_26a;
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  spirv_cross local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  Bitset flags;
  string local_190 [36];
  uint32_t local_16c;
  undefined1 local_168 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Decoration *dec;
  VectorView<spirv_cross::Meta::Decoration> *local_40;
  Vector<Decoration> *memb;
  bool is_block;
  allocator local_25;
  uint local_24;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *res;
  
  pSStack_20 = (SPIRType *)CONCAT44(in_register_00000014,index);
  local_24 = in_ECX;
  type_local = type;
  this_local = this;
  bVar1 = is_legacy((CompilerGLSL *)type);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else {
    pmVar2 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[]((unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                           *)&(type->image).depth,&(pSStack_20->super_IVariant).self);
    bVar1 = Bitset::get(&(pmVar2->decoration).decoration_flags,2);
    local_349 = true;
    if (!bVar1) {
      pmVar2 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[]((unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                             *)&(type->image).depth,&(pSStack_20->super_IVariant).self);
      local_349 = Bitset::get(&(pmVar2->decoration).decoration_flags,3);
    }
    memb._3_1_ = local_349;
    if (local_349 == false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",(allocator *)((long)&memb + 2));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&memb + 2));
    }
    else {
      pmVar2 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[]((unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                             *)&(type->image).depth,&(pSStack_20->super_IVariant).self);
      local_40 = &(pmVar2->members).super_VectorView<spirv_cross::Meta::Decoration>;
      uVar3 = (ulong)local_24;
      sVar4 = VectorView<spirv_cross::Meta::Decoration>::size(local_40);
      if (uVar3 < sVar4) {
        attr.stack_storage.aligned_char._248_8_ =
             VectorView<spirv_cross::Meta::Decoration>::operator[](local_40,(ulong)local_24);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_168);
        local_16c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar1 = Compiler::has_member_decoration
                          ((Compiler *)type,(TypeID)local_16c,local_24,DecorationPassthroughNV);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_190,"passthrough",
                     (allocator *)((long)&flags.higher._M_h._M_single_bucket + 7));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_168,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190
                     );
          ::std::__cxx11::string::~string(local_190);
          ::std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&flags.higher._M_h._M_single_bucket + 7));
        }
        Compiler::combined_decoration_for_member
                  ((Bitset *)local_1d8,(Compiler *)type,pSStack_20,local_24);
        bVar1 = Bitset::get((Bitset *)local_1d8,4);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1f8,"row_major",&local_1f9);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_168,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8
                     );
          ::std::__cxx11::string::~string(local_1f8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        }
        bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x60),0x1e);
        if ((bVar1) &&
           (bVar1 = can_use_io_location((CompilerGLSL *)type,pSStack_20->storage,true), bVar1)) {
          join<char_const(&)[12],unsigned_int&>
                    (local_220,(char (*) [12])"location = ",
                     (uint *)(attr.stack_storage.aligned_char._248_8_ + 0xa4));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_168,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220
                     );
          ::std::__cxx11::string::~string((string *)local_220);
        }
        bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x60),0x1f);
        if ((bVar1) &&
           (bVar1 = can_use_io_location((CompilerGLSL *)type,pSStack_20->storage,true), bVar1)) {
          if ((type[0x16].array.buffer_capacity & 0x100000000) != 0) {
            local_2b2 = 1;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2b0,"Component decoration is not supported in ES targets.",&local_2b1);
            CompilerError::CompilerError(pCVar5,(string *)local_2b0);
            local_2b2 = 0;
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((uint)type[0x16].array.buffer_capacity < 0x1b8) &&
             (0x8b < (uint)type[0x16].array.buffer_capacity)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_240,"GL_ARB_enhanced_layouts",&local_241);
            require_extension_internal((CompilerGLSL *)type,(string *)local_240);
            ::std::__cxx11::string::~string(local_240);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_241);
          }
          else if ((uint)type[0x16].array.buffer_capacity < 0x8c) {
            local_26a = 1;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_268,"Component decoration is not supported in targets below GLSL 1.40."
                       ,&local_269);
            CompilerError::CompilerError(pCVar5,(string *)local_268);
            local_26a = 0;
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          join<char_const(&)[13],unsigned_int&>
                    (local_290,(char (*) [13])"component = ",
                     (uint *)(attr.stack_storage.aligned_char._248_8_ + 0xa8));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_168,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290
                     );
          ::std::__cxx11::string::~string((string *)local_290);
        }
        id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
        bVar1 = Compiler::has_extended_decoration
                          ((Compiler *)type,id,SPIRVCrossDecorationExplicitOffset);
        if ((bVar1) &&
           (bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x60),0x23),
           bVar1)) {
          join<char_const(&)[10],unsigned_int&>
                    (local_2d8,(char (*) [10])0x4dbc9c,
                     (uint *)(attr.stack_storage.aligned_char._248_8_ + 0xb4));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_168,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8
                     );
          ::std::__cxx11::string::~string((string *)local_2d8);
        }
        else if ((pSStack_20->storage == StorageClassOutput) &&
                (bVar1 = Bitset::get((Bitset *)(attr.stack_storage.aligned_char._248_8_ + 0x60),0x23
                                    ), bVar1)) {
          join<char_const(&)[14],unsigned_int&>
                    (local_2f8,(char (*) [14])0x4dbc98,
                     (uint *)(attr.stack_storage.aligned_char._248_8_ + 0xb4));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_168,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8
                     );
          ::std::__cxx11::string::~string((string *)local_2f8);
        }
        bVar1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_168);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_2f9);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
        }
        else {
          local_301 = 0;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"layout(",&local_302);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_302);
          merge(local_328,
                (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_168,", ");
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_328);
          ::std::__cxx11::string::~string((string *)local_328);
          ::std::__cxx11::string::operator+=((string *)this,") ");
          local_301 = 1;
        }
        local_300 = 1;
        Bitset::~Bitset((Bitset *)local_1d8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_168);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",(allocator *)((long)&dec + 7));
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&dec + 7));
      }
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::layout_for_member(const SPIRType &type, uint32_t index)
{
	if (is_legacy())
		return "";

	bool is_block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
	                ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	if (!is_block)
		return "";

	auto &memb = ir.meta[type.self].members;
	if (index >= memb.size())
		return "";
	auto &dec = memb[index];

	SmallVector<string> attr;

	if (has_member_decoration(type.self, index, DecorationPassthroughNV))
		attr.push_back("passthrough");

	// We can only apply layouts on members in block interfaces.
	// This is a bit problematic because in SPIR-V decorations are applied on the struct types directly.
	// This is not supported on GLSL, so we have to make the assumption that if a struct within our buffer block struct
	// has a decoration, it was originally caused by a top-level layout() qualifier in GLSL.
	//
	// We would like to go from (SPIR-V style):
	//
	// struct Foo { layout(row_major) mat4 matrix; };
	// buffer UBO { Foo foo; };
	//
	// to
	//
	// struct Foo { mat4 matrix; }; // GLSL doesn't support any layout shenanigans in raw struct declarations.
	// buffer UBO { layout(row_major) Foo foo; }; // Apply the layout on top-level.
	auto flags = combined_decoration_for_member(type, index);

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	// We don't emit any global layouts, so column_major is default.
	//if (flags & (1ull << DecorationColMajor))
	//    attr.push_back("column_major");

	if (dec.decoration_flags.get(DecorationLocation) && can_use_io_location(type.storage, true))
		attr.push_back(join("location = ", dec.location));

	// Can only declare component if we can declare location.
	if (dec.decoration_flags.get(DecorationComponent) && can_use_io_location(type.storage, true))
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
			attr.push_back(join("component = ", dec.component));
		}
		else
			SPIRV_CROSS_THROW("Component decoration is not supported in ES targets.");
	}

	// SPIRVCrossDecorationPacked is set by layout_for_variable earlier to mark that we need to emit offset qualifiers.
	// This is only done selectively in GLSL as needed.
	if (has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) &&
	    dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("offset = ", dec.offset));
	else if (type.storage == StorageClassOutput && dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("xfb_offset = ", dec.offset));

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}